

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O3

int adios2::utils::printAttributeValue<int>(Engine *fp,IO *io,Attribute<int> *attribute)

{
  DataType adiosvartype;
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  adiosvartype = *(DataType *)(attribute + 0x28);
  if (attribute[0x38] == (Attribute<int>)0x1) {
    print_data(attribute + 0x58,0,adiosvartype,true,false);
  }
  else {
    fputc(0x7b,outf);
    if (*(long *)(attribute + 0x48) - *(long *)(attribute + 0x40) != 0) {
      lVar2 = *(long *)(attribute + 0x48) - *(long *)(attribute + 0x40) >> 2;
      lVar1 = 0;
      uVar3 = 0;
      do {
        print_data((void *)(*(long *)(attribute + 0x40) + lVar1),0,adiosvartype,true,false);
        if (uVar3 < lVar2 - 1U) {
          fwrite(", ",2,1,outf);
        }
        uVar3 = uVar3 + 1;
        lVar1 = lVar1 + 4;
      } while (lVar2 + (ulong)(lVar2 == 0) != uVar3);
    }
    fputc(0x7d,outf);
  }
  return 0;
}

Assistant:

int printAttributeValue(core::Engine *fp, core::IO *io, core::Attribute<T> *attribute)
{
    DataType adiosvartype = attribute->m_Type;
    if (attribute->m_IsSingleValue)
    {
        print_data((void *)&attribute->m_DataSingleValue, 0, adiosvartype, true);
    }
    else
    {
        fprintf(outf, "{");
        size_t nelems = attribute->m_DataArray.size();
        for (size_t j = 0; j < nelems; j++)
        {
            print_data((void *)&attribute->m_DataArray[j], 0, adiosvartype, true);
            if (j < nelems - 1)
            {
                fprintf(outf, ", ");
            }
        }
        fprintf(outf, "}");
    }
    return 0;
}